

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

int __thiscall Clasp::Cli::ClaspAppBase::exitCode(ClaspAppBase *this,RunSummary *run)

{
  bool bVar1;
  long in_RSI;
  int ec;
  undefined4 local_14;
  
  local_14 = 0;
  bVar1 = ClaspFacade::Summary::sat((Summary *)0x116eb0);
  if (bVar1) {
    local_14 = 10;
  }
  bVar1 = ClaspFacade::Summary::complete((Summary *)0x116ecb);
  if (bVar1) {
    local_14 = local_14 | 0x14;
  }
  bVar1 = SolveResult::interrupted((SolveResult *)(in_RSI + 0x44));
  if (bVar1) {
    local_14 = local_14 | 1;
  }
  return local_14;
}

Assistant:

int ClaspAppBase::exitCode(const RunSummary& run) const {
	int ec = 0;
	if (run.sat())               { ec |= E_SAT;       }
	if (run.complete())          { ec |= E_EXHAUST;   }
	if (run.result.interrupted()){ ec |= E_INTERRUPT; }
	return ec;
}